

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O1

PClassActor * T_GetMobjType(svalue_t *arg)

{
  int iVar1;
  uint uVar2;
  PClassActor *pPVar3;
  AActor *pAVar4;
  undefined4 extraout_var;
  
  if (arg->type == 2) {
    pAVar4 = actorvalue(arg);
    if (pAVar4 == (AActor *)0x0) {
      pPVar3 = (PClassActor *)0x0;
    }
    else {
      if ((pAVar4->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar1 = (**(pAVar4->super_DThinker).super_DObject._vptr_DObject)(pAVar4);
        (pAVar4->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar1);
      }
      pPVar3 = (PClassActor *)(pAVar4->super_DThinker).super_DObject.Class;
    }
  }
  else if (arg->type == 0) {
    pPVar3 = PClass::FindActor(&arg->string);
    if (pPVar3 == (PClassActor *)0x0) {
      pPVar3 = (PClassActor *)0x0;
      script_error("unknown object type: %s\n",(arg->string).Chars);
    }
  }
  else {
    uVar2 = intvalue(arg);
    if (uVar2 < 0x8b) {
      pPVar3 = ActorTypes[uVar2];
    }
    else {
      pPVar3 = (PClassActor *)0x0;
    }
    if (pPVar3 == (PClassActor *)0x0) {
      script_error("unknown object type: %i\n",(ulong)uVar2);
    }
  }
  return pPVar3;
}

Assistant:

PClassActor * T_GetMobjType(svalue_t arg)
{
	PClassActor * pclass=NULL;
	
	if (arg.type==svt_string)
	{
		pclass=PClass::FindActor(arg.string);

		// invalid object to spawn
		if(!pclass) script_error("unknown object type: %s\n", arg.string.GetChars()); 
	}
	else if (arg.type==svt_mobj)
	{
		AActor * mo = actorvalue(arg);
		if (mo) pclass = mo->GetClass();
	}
	else
	{
		int objtype = intvalue(arg);
		if (objtype>=0 && objtype<int(countof(ActorTypes))) pclass=ActorTypes[objtype];
		else pclass=NULL;

		// invalid object to spawn
		if(!pclass) script_error("unknown object type: %i\n", objtype); 
	}
	return pclass;
}